

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O0

void __thiscall
Imf_3_4::Array2D<Imf_3_4::PreviewRgba>::resizeErase
          (Array2D<Imf_3_4::PreviewRgba> *this,long sizeX,long sizeY)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  PreviewRgba *pPVar4;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  PreviewRgba *tmp;
  PreviewRgba *local_58;
  
  uVar2 = in_RSI * in_RDX;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pPVar4 = (PreviewRgba *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_58 = pPVar4;
    do {
      PreviewRgba::PreviewRgba(local_58,'\0','\0','\0',0xff);
      local_58 = local_58 + 1;
    } while (local_58 != pPVar4 + uVar2);
  }
  if ((void *)in_RDI[2] != (void *)0x0) {
    operator_delete__((void *)in_RDI[2]);
  }
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = (long)pPVar4;
  return;
}

Assistant:

inline void
Array2D<T>::resizeErase (long sizeX, long sizeY)
{
    T* tmp = new T[sizeX * sizeY];
    delete[] _data;
    _sizeX = sizeX;
    _sizeY = sizeY;
    _data  = tmp;
}